

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

Point3fi * __thiscall
pbrt::Transform::ApplyInverse(Point3fi *__return_storage_ptr__,Transform *this,Point3fi *p)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Interval IVar32;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar33 [64];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auStack_98 [8];
  Tuple3<pbrt::Vector3,_float> local_90;
  Interval local_80;
  undefined1 local_78 [16];
  Interval local_68;
  undefined8 uStack_60;
  Interval local_58;
  undefined8 uStack_50;
  Point3fi local_40;
  Point3f local_24;
  undefined1 extraout_var [56];
  
  bVar14 = &stack0x00000000 != (undefined1 *)0x98;
  bVar13 = (POPCOUNT((ulong)auStack_98 & 0xff) & 1U) == 0;
  FVar1 = (p->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar24 = ZEXT416((uint)(p->super_Point3<pbrt::Interval>).
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low);
  auVar15 = vaddss_avx512f(auVar24,ZEXT416((uint)FVar1));
  auVar16 = vmulss_avx512f(auVar15,ZEXT416(0x3f000000));
  FVar2 = (p->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar15 = vaddss_avx512f(ZEXT416((uint)FVar2),
                           ZEXT416((uint)(p->super_Point3<pbrt::Interval>).
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high));
  auVar17 = vmulss_avx512f(auVar15,ZEXT416(0x3f000000));
  FVar3 = (p->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
  auVar15 = vaddss_avx512f(ZEXT416((uint)FVar3),
                           ZEXT416((uint)(p->super_Point3<pbrt::Interval>).
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high));
  auVar25 = ZEXT416(0x3f000000);
  auVar18 = vmulss_avx512f(auVar15,auVar25);
  FVar4 = (this->mInv).m[0][0];
  FVar5 = (this->mInv).m[0][2];
  auVar31 = ZEXT416((uint)(this->mInv).m[0][3]);
  auVar10 = vfmadd213ss_fma(auVar18,ZEXT416((uint)FVar5),auVar31);
  FVar6 = (this->mInv).m[1][0];
  auVar15 = vbroadcastss_avx512vl(auVar17);
  auVar30 = vinsertps_avx512f(*(undefined1 (*) [16])((this->mInv).m[0] + 1),
                              ZEXT416((uint)(this->mInv).m[1][1]),0x10);
  auVar19 = vmulps_avx512vl(auVar15,auVar30);
  auVar15 = vmovshdup_avx(auVar19);
  auVar20 = vfmadd213ss_avx512f(auVar16,ZEXT416((uint)FVar4),auVar19);
  auVar21 = vfmadd231ss_avx512f(auVar15,ZEXT416((uint)FVar6),auVar16);
  FVar7 = (this->mInv).m[1][2];
  auVar38 = ZEXT416((uint)(this->mInv).m[1][3]);
  auVar22 = vfmadd213ss_avx512f(auVar18,ZEXT416((uint)FVar7),auVar38);
  fVar8 = (this->mInv).m[2][0];
  auVar37 = ZEXT416((uint)(this->mInv).m[2][1]);
  auVar23 = vmulss_avx512f(auVar17,auVar37);
  auVar11 = vfmadd213ss_fma(auVar16,ZEXT416((uint)fVar8),auVar23);
  fVar9 = (this->mInv).m[2][2];
  auVar36 = ZEXT416((uint)(this->mInv).m[2][3]);
  auVar12 = vfmadd213ss_fma(auVar18,ZEXT416((uint)fVar9),auVar36);
  auVar15 = vmulss_avx512f(auVar17,ZEXT416((uint)(this->mInv).m[3][1]));
  auVar15 = vfmadd231ss_avx512f(auVar15,auVar16,ZEXT416((uint)(this->mInv).m[3][0]));
  auVar17 = vfmadd213ss_avx512f(ZEXT416((uint)(this->mInv).m[3][2]),auVar18,
                                ZEXT416((uint)(this->mInv).m[3][3]));
  vaddss_avx512f(auVar15,auVar17);
  vsubss_avx512f(ZEXT416((uint)FVar1),auVar24);
  auVar17 = vxorps_avx512vl(ZEXT416((uint)FVar1),ZEXT416((uint)FVar1));
  auVar15 = vucomiss_avx512f(auVar17);
  fVar35 = auVar16._0_4_;
  fVar34 = auVar18._0_4_;
  if ((!bVar14) && (!bVar13)) {
    vsubss_avx512f(ZEXT416((uint)(p->super_Point3<pbrt::Interval>).
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                   ZEXT416((uint)FVar2));
    auVar17 = vucomiss_avx512f(auVar17);
    if ((!bVar14) && (!bVar13)) {
      vsubss_avx512f(ZEXT416((uint)(p->super_Point3<pbrt::Interval>).
                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),
                     ZEXT416((uint)FVar3));
      auVar17 = vxorps_avx512vl(auVar17,auVar17);
      vucomiss_avx512f(auVar17);
      if ((!bVar14) && (!bVar13)) {
        auVar15 = vinsertps_avx512f(ZEXT416((uint)FVar4),ZEXT416((uint)FVar6),0x10);
        auVar17._0_4_ = fVar35 * auVar15._0_4_;
        auVar17._4_4_ = fVar35 * auVar15._4_4_;
        auVar17._8_4_ = fVar35 * auVar15._8_4_;
        auVar17._12_4_ = fVar35 * auVar15._12_4_;
        auVar36._8_4_ = 0x7fffffff;
        auVar36._0_8_ = 0x7fffffff7fffffff;
        auVar36._12_4_ = 0x7fffffff;
        auVar15 = vandps_avx(auVar19,auVar36);
        auVar30 = vinsertps_avx512f(ZEXT416((uint)FVar5),ZEXT416((uint)FVar7),0x10);
        auVar37._0_4_ = fVar34 * auVar30._0_4_;
        auVar37._4_4_ = fVar34 * auVar30._4_4_;
        auVar37._8_4_ = fVar34 * auVar30._8_4_;
        auVar37._12_4_ = fVar34 * auVar30._12_4_;
        auVar30 = vandps_avx(auVar17,auVar36);
        auVar16 = vandps_avx(auVar37,auVar36);
        auVar18._0_4_ = auVar30._0_4_ + auVar15._0_4_ + auVar16._0_4_;
        auVar18._4_4_ = auVar30._4_4_ + auVar15._4_4_ + auVar16._4_4_;
        auVar18._8_4_ = auVar30._8_4_ + auVar15._8_4_ + auVar16._8_4_;
        auVar18._12_4_ = auVar30._12_4_ + auVar15._12_4_ + auVar16._12_4_;
        auVar16._8_4_ = 0x34400002;
        auVar16._0_8_ = 0x3440000234400002;
        auVar16._12_4_ = 0x34400002;
        auVar15 = vmulps_avx512vl(auVar18,auVar16);
        local_90._0_8_ = vmovlps_avx(auVar15);
        auVar15 = vandps_avx(auVar36,ZEXT416((uint)(fVar8 * fVar35)));
        auVar30 = vandps_avx(auVar23,auVar36);
        auVar16 = vandps_avx(auVar36,ZEXT416((uint)(fVar9 * fVar34)));
        local_90.z = (auVar30._0_4_ + auVar15._0_4_ + auVar16._0_4_) * 1.7881396e-07;
        goto LAB_004b3358;
      }
    }
  }
  auVar17 = vmulss_avx512f(auVar15,auVar25);
  auVar15 = vsubss_avx512f(ZEXT416((uint)(p->super_Point3<pbrt::Interval>).
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                           ZEXT416((uint)FVar2));
  auVar24 = vmulss_avx512f(auVar15,auVar25);
  auVar15 = vsubss_avx512f(ZEXT416((uint)(p->super_Point3<pbrt::Interval>).
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),
                           ZEXT416((uint)FVar3));
  auVar25 = vmulss_avx512f(auVar15,auVar25);
  auVar15 = vinsertps_avx512f(ZEXT416((uint)FVar4),ZEXT416((uint)FVar6),0x10);
  auVar26 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar27 = vandps_avx512vl(auVar15,auVar26);
  auVar28 = vandps_avx512vl(auVar30,auVar26);
  auVar30 = vinsertps_avx512f(ZEXT416((uint)FVar5),ZEXT416((uint)FVar7),0x10);
  auVar29 = vandps_avx512vl(auVar30,auVar26);
  auVar16 = vbroadcastss_avx512vl(auVar16);
  auVar16 = vmulps_avx512vl(auVar16,auVar15);
  auVar15 = vbroadcastss_avx512vl(auVar18);
  auVar30 = vmulps_avx512vl(auVar15,auVar30);
  auVar15 = vinsertps_avx512f(auVar31,auVar38,0x10);
  auVar15 = vandps_avx512vl(auVar15,auVar26);
  auVar18 = vbroadcastss_avx512vl(auVar24);
  auVar18 = vmulps_avx512vl(auVar28,auVar18);
  auVar31 = vbroadcastss_avx512vl(auVar17);
  auVar18 = vfmadd213ps_avx512vl(auVar31,auVar27,auVar18);
  auVar31 = vbroadcastss_avx512vl(auVar25);
  auVar18 = vfmadd213ps_avx512vl(auVar31,auVar29,auVar18);
  auVar16 = vandps_avx512vl(auVar16,auVar26);
  auVar19 = vandps_avx512vl(auVar19,auVar26);
  auVar16 = vaddps_avx512vl(auVar16,auVar19);
  auVar30 = vandps_avx512vl(auVar30,auVar26);
  auVar19._0_4_ = auVar15._0_4_ + auVar16._0_4_ + auVar30._0_4_;
  auVar19._4_4_ = auVar15._4_4_ + auVar16._4_4_ + auVar30._4_4_;
  auVar19._8_4_ = auVar15._8_4_ + auVar16._8_4_ + auVar30._8_4_;
  auVar19._12_4_ = auVar15._12_4_ + auVar16._12_4_ + auVar30._12_4_;
  auVar15._8_4_ = 0x34400002;
  auVar15._0_8_ = 0x3440000234400002;
  auVar15._12_4_ = 0x34400002;
  auVar15 = vmulps_avx512vl(auVar19,auVar15);
  auVar30._8_4_ = 0x3f800002;
  auVar30._0_8_ = 0x3f8000023f800002;
  auVar30._12_4_ = 0x3f800002;
  auVar15 = vfmadd231ps_avx512vl(auVar15,auVar18,auVar30);
  local_90._0_8_ = vmovlps_avx(auVar15);
  auVar15 = vandps_avx512vl(ZEXT416((uint)fVar8),auVar26);
  auVar30 = vandps_avx512vl(auVar37,auVar26);
  auVar30 = vmulss_avx512f(auVar30,auVar24);
  auVar15 = vfmadd231ss_avx512f(auVar30,auVar17,auVar15);
  auVar30 = vandps_avx512vl(ZEXT416((uint)fVar9),auVar26);
  auVar15 = vfmadd213ss_avx512f(auVar30,auVar25,auVar15);
  auVar30 = vandps_avx512vl(ZEXT416((uint)(fVar8 * fVar35)),auVar26);
  auVar16 = vandps_avx512vl(auVar23,auVar26);
  auVar17 = vandps_avx512vl(ZEXT416((uint)(fVar9 * fVar34)),auVar26);
  auVar18 = vandps_avx512vl(auVar36,auVar26);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)((auVar18._0_4_ +
                                           auVar16._0_4_ + auVar30._0_4_ + auVar17._0_4_) *
                                          1.7881396e-07)),auVar15,ZEXT416(0x3f800002));
  local_90.z = auVar15._0_4_;
LAB_004b3358:
  local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low =
       auVar20._0_4_ + auVar10._0_4_;
  local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high =
       auVar21._0_4_ + auVar22._0_4_;
  local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
       auVar11._0_4_ + auVar12._0_4_;
  local_78 = vucomiss_avx512f(ZEXT416(0x3f800000));
  if ((bVar14) || (bVar13)) {
    local_24.super_Tuple3<pbrt::Point3,_float>.x =
         local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    local_24.super_Tuple3<pbrt::Point3,_float>.y =
         local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    local_24.super_Tuple3<pbrt::Point3,_float>.z =
         local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    Point3fi::Point3fi(&local_40,&local_24,(Vector3f *)&local_90);
    IVar32.high = (Float)local_78._0_4_;
    IVar32.low = (Float)local_78._0_4_;
    local_78._8_4_ = local_78._0_4_;
    local_78._4_4_ = local_78._0_4_;
    local_78._12_4_ = local_78._0_4_;
    local_58 = Interval::operator/(&local_80,IVar32);
    uStack_50 = extraout_XMM0_Qb;
    local_68 = Interval::operator/(&local_80,(Interval)local_78._0_8_);
    local_80 = local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
    uStack_60 = extraout_XMM0_Qb_00;
    auVar33._0_8_ = Interval::operator/(&local_80,(Interval)local_78._0_8_);
    auVar33._8_56_ = extraout_var;
    auVar11._8_8_ = uStack_50;
    auVar11._0_4_ = local_58.low;
    auVar11._4_4_ = local_58.high;
    auVar10._8_8_ = uStack_60;
    auVar10._0_4_ = local_68.low;
    auVar10._4_4_ = local_68.high;
    auVar15 = vunpcklpd_avx(auVar11,auVar10);
    (__return_storage_ptr__->super_Point3<pbrt::Interval>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = (Float)(int)auVar15._0_8_;
    (__return_storage_ptr__->super_Point3<pbrt::Interval>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)(int)((ulong)auVar15._0_8_ >> 0x20);
    (__return_storage_ptr__->super_Point3<pbrt::Interval>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = (Float)(int)auVar15._8_8_;
    (__return_storage_ptr__->super_Point3<pbrt::Interval>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = (Float)(int)((ulong)auVar15._8_8_ >> 0x20);
    IVar32 = (Interval)vmovlps_avx(auVar33._0_16_);
    (__return_storage_ptr__->super_Point3<pbrt::Interval>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z = IVar32;
  }
  else {
    Point3fi::Point3fi(__return_storage_ptr__,(Point3f *)0x58,(Vector3f *)&DAT_00000008);
  }
  return __return_storage_ptr__;
}

Assistant:

Point3fi Transform::ApplyInverse(const Point3fi &p) const {
    Float x = Float(p.x), y = Float(p.y), z = Float(p.z);
    // Compute transformed coordinates from point _pt_
    Float xp = (mInv[0][0] * x + mInv[0][1] * y) + (mInv[0][2] * z + mInv[0][3]);
    Float yp = (mInv[1][0] * x + mInv[1][1] * y) + (mInv[1][2] * z + mInv[1][3]);
    Float zp = (mInv[2][0] * x + mInv[2][1] * y) + (mInv[2][2] * z + mInv[2][3]);
    Float wp = (mInv[3][0] * x + mInv[3][1] * y) + (mInv[3][2] * z + mInv[3][3]);

    // Compute absolute error for transformed point
    Vector3f pOutError;
    if (p.IsExact()) {
        pOutError.x = gamma(3) * (std::abs(mInv[0][0] * x) + std::abs(mInv[0][1] * y) +
                                  std::abs(mInv[0][2] * z));
        pOutError.y = gamma(3) * (std::abs(mInv[1][0] * x) + std::abs(mInv[1][1] * y) +
                                  std::abs(mInv[1][2] * z));
        pOutError.z = gamma(3) * (std::abs(mInv[2][0] * x) + std::abs(mInv[2][1] * y) +
                                  std::abs(mInv[2][2] * z));
    } else {
        Vector3f pInError = p.Error();
        pOutError.x = (gamma(3) + 1) * (std::abs(mInv[0][0]) * pInError.x +
                                        std::abs(mInv[0][1]) * pInError.y +
                                        std::abs(mInv[0][2]) * pInError.z) +
                      gamma(3) * (std::abs(mInv[0][0] * x) + std::abs(mInv[0][1] * y) +
                                  std::abs(mInv[0][2] * z) + std::abs(mInv[0][3]));
        pOutError.y = (gamma(3) + 1) * (std::abs(mInv[1][0]) * pInError.x +
                                        std::abs(mInv[1][1]) * pInError.y +
                                        std::abs(mInv[1][2]) * pInError.z) +
                      gamma(3) * (std::abs(mInv[1][0] * x) + std::abs(mInv[1][1] * y) +
                                  std::abs(mInv[1][2] * z) + std::abs(mInv[1][3]));
        pOutError.z = (gamma(3) + 1) * (std::abs(mInv[2][0]) * pInError.x +
                                        std::abs(mInv[2][1]) * pInError.y +
                                        std::abs(mInv[2][2]) * pInError.z) +
                      gamma(3) * (std::abs(mInv[2][0] * x) + std::abs(mInv[2][1] * y) +
                                  std::abs(mInv[2][2] * z) + std::abs(mInv[2][3]));
    }

    if (wp == 1)
        return Point3fi(Point3f(xp, yp, zp), pOutError);
    else
        return Point3fi(Point3f(xp, yp, zp), pOutError) / wp;
}